

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O0

void read_all(lua_State *L,FILE *f)

{
  char *__ptr;
  char *p;
  luaL_Buffer b;
  size_t nr;
  FILE *f_local;
  lua_State *L_local;
  
  luaL_buffinit(L,(luaL_Buffer *)&p);
  do {
    __ptr = luaL_prepbuffsize((luaL_Buffer *)&p,0x400);
    b.init._1016_8_ = fread(__ptr,1,0x400,(FILE *)f);
    b.size = b.init._1016_8_ + b.size;
  } while (b.init._1016_8_ == 0x400);
  luaL_pushresult((luaL_Buffer *)&p);
  return;
}

Assistant:

static void read_all (lua_State *L, FILE *f) {
  size_t nr;
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  do {  /* read file in chunks of LUAL_BUFFERSIZE bytes */
    char *p = luaL_prepbuffer(&b);
    nr = fread(p, sizeof(char), LUAL_BUFFERSIZE, f);
    luaL_addsize(&b, nr);
  } while (nr == LUAL_BUFFERSIZE);
  luaL_pushresult(&b);  /* close buffer */
}